

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec-wrapper.h
# Opt level: O2

string * __thiscall
wasm::generateSpecWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  BasicType BVar5;
  long *plVar6;
  Type *this_00;
  undefined8 *puVar7;
  char *__assertion;
  Name NVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  Iterator __begin2;
  allocator<char> local_31;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar6 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  do {
    if (plVar6 == plVar1) {
      return __return_storage_ptr__;
    }
    lVar2 = *plVar6;
    if (*(int *)(lVar2 + 0x10) == 0) {
      puVar7 = (undefined8 *)(lVar2 + 0x18);
      if (*(char *)(lVar2 + 0x28) != '\0') {
        puVar7 = (undefined8 *)0x0;
      }
      NVar8.super_IString.str._M_str = (char *)*puVar7;
      NVar8.super_IString.str._M_len = (size_t)this;
      ::wasm::Module::getFunctionOrNull(NVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"(invoke \"",&local_31)
      ;
      IString::toString_abi_cxx11_(&local_d8,(IString *)*plVar6);
      std::operator+(&local_b8,&local_98,&local_d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_b8,"\" ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      local_b8._M_dataplus._M_p = (pointer)::wasm::HeapType::getSignature();
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_78 = (undefined1  [8])&local_b8;
      PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::end((Type *)&local_b8);
      for (; PVar4.index = (size_t)__begin2.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar4.parent = (Type *)local_78, PVar9 != PVar4;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        this_00 = (Type *)::wasm::Type::Iterator::operator*((Iterator *)local_78);
        uVar3 = this_00->id;
        if ((uVar3 & 1) != 0 && 6 < uVar3) {
          __assertion = "!param.isTuple() && \"Unexpected tuple type\"";
LAB_001b79a1:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                        ,0x25,"std::string wasm::generateSpecWrapper(Module &)");
        }
        if (6 < uVar3) {
          __assertion = "param.isBasic() && \"TODO: handle compound types\"";
          goto LAB_001b79a1;
        }
        BVar5 = Type::getBasic(this_00);
        switch(BVar5) {
        case none:
        case unreachable:
          ::wasm::handle_unreachable
                    ("unexpected type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                     ,0x38);
        case i32:
          break;
        case i64:
          break;
        case f32:
          break;
        case f64:
          break;
        case v128:
          break;
        default:
          goto switchD_001b7915_default;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
switchD_001b7915_default:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

inline std::string generateSpecWrapper(Module& wasm) {
  std::string ret;
  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue; // something exported other than a function
    }
    auto* func = wasm.getFunctionOrNull(*exp->getInternalName());
    ret += std::string("(invoke \"") + exp->name.toString() + "\" ";
    for (const auto& param : func->getParams()) {
      // zeros in arguments TODO more?
      TODO_SINGLE_COMPOUND(param);
      switch (param.getBasic()) {
        case Type::i32:
          ret += "(i32.const 0)";
          break;
        case Type::i64:
          ret += "(i64.const 0)";
          break;
        case Type::f32:
          ret += "(f32.const 0)";
          break;
        case Type::f64:
          ret += "(f64.const 0)";
          break;
        case Type::v128:
          ret += "(v128.const i32x4 0 0 0 0)";
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      ret += " ";
    }
    ret += ") ";
  }
  return ret;
}